

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O1

void __thiscall setup::message_entry::load(message_entry *this,istream *is,info *i)

{
  ostringstream *this_00;
  pointer plVar1;
  pointer plVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  char buffer [4];
  logger local_1a8;
  
  util::encoded_string::load(is,&this->name,i->codepage,(bitset<256UL> *)0x0);
  util::binary_string::load(is,&this->value);
  std::istream::read((char *)is,(long)&local_1a8);
  uVar3 = (ulong)(int)local_1a8.level;
  this->language = local_1a8.level;
  if ((long)uVar3 < 0) {
    puVar5 = &i->codepage;
  }
  else {
    plVar1 = (i->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar2 = (i->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar4 = ((long)plVar2 - (long)plVar1 >> 3) * 0x51b3bea3677d46cf;
    if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
      if (plVar1 != plVar2) {
        this_00 = &local_1a8.buffer;
        local_1a8.level = Warning;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Language index out of bounds: ",0x1e);
        std::ostream::operator<<(this_00,this->language);
        logger::~logger(&local_1a8);
      }
      (this->value)._M_string_length = 0;
      *(this->value)._M_dataplus._M_p = '\0';
      return;
    }
    puVar5 = &plVar1[uVar3].codepage;
  }
  util::to_utf8(&this->value,*puVar5,(bitset<256UL> *)0x0);
  return;
}

Assistant:

void message_entry::load(std::istream & is, const info & i) {
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::binary_string(value);
	
	language = util::load<boost::int32_t>(is);
	
	boost::uint32_t codepage;
	if(language < 0) {
		codepage = i.codepage;
	} else if(size_t(language) >= i.languages.size()) {
		if(!i.languages.empty()) {
			log_warning << "Language index out of bounds: " << language;
		}
		value.clear();
		return;
	} else {
		codepage = i.languages[size_t(language)].codepage;
	}
	
	util::to_utf8(value, codepage);
}